

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_int64(void)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int64_t i64;
  
  uVar2 = bson_bcon_magic();
  uVar2 = bcon_new(0,"foo",uVar2,0x11,10,0);
  uVar3 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar2,"foo",uVar3,0x11,&i64,0);
  if (cVar1 == '\0') {
    pcVar4 = "BCON_EXTRACT (bcon, \"foo\", BCONE_INT64 (i64))";
    uVar2 = 0x10c;
  }
  else {
    if (i64 == 10) {
      bson_destroy(uVar2);
      return;
    }
    pcVar4 = "i64 == 10";
    uVar2 = 0x10e;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar2,"test_int64",pcVar4);
  abort();
}

Assistant:

static void
test_int64 (void)
{
   int64_t i64;

   bson_t *bcon = BCON_NEW ("foo", BCON_INT64 (10));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_INT64 (i64)));

   BSON_ASSERT (i64 == 10);

   bson_destroy (bcon);
}